

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  undefined4 *puVar2;
  bool bVar3;
  _Bool *p_Var4;
  _Bool _Var5;
  char cVar6;
  CURLcode CVar7;
  int iVar8;
  imapstate iVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  _Bool *p_Var13;
  char *pcVar14;
  Curl_easy *pCVar15;
  char *pcVar16;
  char *pcVar17;
  char *value;
  char *name;
  char *local_58;
  char *local_50;
  connectdata *local_48;
  size_t local_40;
  _Bool *local_38;
  
  *done = false;
  pCVar15 = conn->data;
  pvVar1 = (pCVar15->req).protop;
  pcVar14 = (pCVar15->state).path;
  lVar12 = 1;
  pcVar17 = pcVar14 + -1;
  local_38 = done;
  do {
    pcVar16 = pcVar17;
    pcVar17 = pcVar16 + 1;
    _Var5 = imap_is_bchar(pcVar16[1]);
    lVar12 = lVar12 + -1;
  } while (_Var5);
  if (lVar12 == 0) {
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  else {
    pcVar10 = pcVar17;
    if ((pcVar14 < pcVar17) && (pcVar10 = pcVar16, *pcVar16 != '/')) {
      pcVar10 = pcVar17;
    }
    CVar7 = Curl_urldecode(pCVar15,pcVar14,(long)pcVar10 - (long)pcVar14,(char **)((long)pvVar1 + 8)
                           ,(size_t *)0x0,true);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
  }
  cVar6 = *pcVar17;
  while (cVar6 == ';') {
    pcVar14 = pcVar17 + 1;
    pcVar16 = pcVar17 + 2;
    sVar11 = 0;
    pcVar17 = pcVar14;
    while( true ) {
      if (pcVar16[-1] == '\0') {
        return CURLE_URL_MALFORMAT;
      }
      if (pcVar16[-1] == '=') break;
      pcVar16 = pcVar16 + 1;
      sVar11 = sVar11 + 1;
      pcVar17 = pcVar17 + 1;
    }
    local_48 = conn;
    CVar7 = Curl_urldecode(pCVar15,pcVar14,sVar11,&local_50,(size_t *)0x0,true);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    sVar11 = 0xffffffffffffffff;
    do {
      pcVar14 = pcVar17 + 1;
      pcVar17 = pcVar17 + 1;
      _Var5 = imap_is_bchar(*pcVar14);
      sVar11 = sVar11 + 1;
    } while (_Var5);
    CVar7 = Curl_urldecode(pCVar15,pcVar16,sVar11,&local_58,&local_40,true);
    if (CVar7 != CURLE_OK) {
      (*Curl_cfree)(local_50);
      return CVar7;
    }
    iVar8 = Curl_strcasecompare(local_50,"UIDVALIDITY");
    if ((iVar8 == 0) || (*(long *)((long)pvVar1 + 0x10) != 0)) {
      iVar8 = Curl_strcasecompare(local_50,"UID");
      if ((iVar8 == 0) || (*(long *)((long)pvVar1 + 0x18) != 0)) {
        iVar8 = Curl_strcasecompare(local_50,"SECTION");
        conn = local_48;
        if ((iVar8 == 0) || (*(long *)((long)pvVar1 + 0x20) != 0)) {
          iVar8 = Curl_strcasecompare(local_50,"PARTIAL");
          if ((iVar8 == 0) || (*(long *)((long)pvVar1 + 0x28) != 0)) {
            (*Curl_cfree)(local_50);
            (*Curl_cfree)(local_58);
            return CURLE_URL_MALFORMAT;
          }
          if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
            local_58[local_40 - 1] = '\0';
          }
          *(char **)((long)pvVar1 + 0x28) = local_58;
        }
        else {
          if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
            local_58[local_40 - 1] = '\0';
          }
          *(char **)((long)pvVar1 + 0x20) = local_58;
        }
      }
      else {
        if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
          local_58[local_40 - 1] = '\0';
        }
        *(char **)((long)pvVar1 + 0x18) = local_58;
        conn = local_48;
      }
    }
    else {
      if ((local_40 != 0) && (local_58[local_40 - 1] == '/')) {
        local_58[local_40 - 1] = '\0';
      }
      *(char **)((long)pvVar1 + 0x10) = local_58;
      conn = local_48;
    }
    local_58 = (char *)0x0;
    (*Curl_cfree)(local_50);
    (*Curl_cfree)(local_58);
    cVar6 = *pcVar17;
  }
  if (((*(long *)((long)pvVar1 + 8) != 0) && (cVar6 == '?')) &&
     (*(long *)((long)pvVar1 + 0x18) == 0)) {
    sVar11 = 0xffffffffffffffff;
    do {
      _Var5 = imap_is_bchar(pcVar17[sVar11 + 2]);
      sVar11 = sVar11 + 1;
    } while (_Var5);
    CVar7 = Curl_urldecode(pCVar15,pcVar17 + 1,sVar11,(char **)((long)pvVar1 + 0x30),(size_t *)0x0,
                           true);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    cVar6 = (pcVar17 + 1)[sVar11];
  }
  if (cVar6 != '\0') {
    return CURLE_URL_MALFORMAT;
  }
  pCVar15 = conn->data;
  pcVar14 = (pCVar15->set).str[6];
  if (pcVar14 != (char *)0x0) {
    pvVar1 = (pCVar15->req).protop;
    CVar7 = Curl_urldecode(pCVar15,pcVar14,0,(char **)((long)pvVar1 + 0x38),(size_t *)0x0,true);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    pcVar14 = *(char **)((long)pvVar1 + 0x38);
    pcVar17 = pcVar14;
    for (; *pcVar14 != '\0'; pcVar14 = pcVar14 + 1) {
      if (*pcVar14 == ' ') {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        *(char **)((long)pvVar1 + 0x40) = pcVar14;
        *pcVar17 = '\0';
        if (*(long *)((long)pvVar1 + 0x40) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        break;
      }
      pcVar17 = pcVar17 + 1;
    }
  }
  pCVar15 = conn->data;
  (pCVar15->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar15,0);
  Curl_pgrsSetDownloadCounter(pCVar15,0);
  Curl_pgrsSetUploadSize(pCVar15,-1);
  Curl_pgrsSetDownloadSize(pCVar15,-1);
  pCVar15 = conn->data;
  puVar2 = (undefined4 *)(pCVar15->req).protop;
  if ((pCVar15->set).opt_no_body == true) {
    *puVar2 = 1;
  }
  *local_38 = false;
  pcVar14 = *(char **)(puVar2 + 2);
  if (pcVar14 == (char *)0x0) {
    if ((pCVar15->set).upload == true) {
      pcVar14 = "Cannot APPEND without a mailbox.";
      goto LAB_00134248;
    }
    goto LAB_001340dd;
  }
  pcVar17 = (conn->proto).imapc.mailbox;
  if (((pcVar17 == (char *)0x0) || (iVar8 = strcmp(pcVar14,pcVar17), iVar8 != 0)) ||
     ((*(char **)(puVar2 + 4) != (char *)0x0 &&
      ((pcVar16 = (conn->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0 &&
       (iVar8 = strcmp(*(char **)(puVar2 + 4),pcVar16), iVar8 != 0)))))) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  if ((pCVar15->set).upload == false) {
    if (*(long *)(puVar2 + 0xe) == 0) {
      if (!bVar3) {
        if ((*(long *)(puVar2 + 6) != 0) || (*(long *)(puVar2 + 0xc) != 0)) goto LAB_00134194;
        goto LAB_001340dd;
      }
      if (*(long *)(puVar2 + 6) == 0) {
        if (*(long *)(puVar2 + 0xc) == 0) goto LAB_001340dd;
        CVar7 = imap_perform_search(conn);
      }
      else {
        CVar7 = imap_perform_fetch(conn);
      }
    }
    else {
      if (!bVar3) {
LAB_00134194:
        (*Curl_cfree)(pcVar17);
        (conn->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        if (*(char **)(puVar2 + 2) == (char *)0x0) {
          pCVar15 = conn->data;
          pcVar14 = "Cannot SELECT without a mailbox.";
LAB_00134248:
          Curl_failf(pCVar15,pcVar14);
          return CURLE_URL_MALFORMAT;
        }
        pcVar14 = imap_atom(*(char **)(puVar2 + 2),false);
        if (pcVar14 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar7 = imap_sendf(conn,"SELECT %s",pcVar14);
        (*Curl_cfree)(pcVar14);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        iVar9 = IMAP_SELECT;
        goto LAB_001341fd;
      }
LAB_001340dd:
      CVar7 = imap_perform_list(conn);
    }
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
  }
  else {
    if ((pCVar15->state).infilesize < 0) {
      Curl_failf(pCVar15,"Cannot APPEND with unknown input file size\n");
      return CURLE_UPLOAD_FAILED;
    }
    pcVar14 = imap_atom(pcVar14,false);
    if (pcVar14 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar7 = imap_sendf(conn,"APPEND %s (\\Seen) {%lld}",pcVar14,(conn->data->state).infilesize);
    (*Curl_cfree)(pcVar14);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    iVar9 = IMAP_APPEND;
LAB_001341fd:
    (conn->proto).imapc.state = iVar9;
  }
  p_Var4 = local_38;
  p_Var13 = local_38;
  CVar7 = imap_multi_statemach(conn,local_38);
  if (CVar7 == CURLE_OK) {
    CVar7 = CURLE_OK;
    if (*p_Var4 == true) {
      imap_dophase_done(conn,SUB81(p_Var13,0));
      CVar7 = CURLE_OK;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}